

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void llb_buildsystem_command_interface_task_needs_input
               (llb_task_interface_t ti,llb_build_key_t *key,uintptr_t inputID)

{
  TaskInterface *coreti;
  TaskInterface local_48;
  string local_38 [32];
  
  local_48.ctx = ti.ctx;
  local_48.impl = ti.impl;
  std::__cxx11::string::string(local_38,(string *)(key + 0x10));
  llbuild::core::TaskInterface::request(&local_48,(KeyType *)local_38,inputID);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void llb_buildsystem_command_interface_task_needs_input(llb_task_interface_t ti, llb_build_key_t* key, uintptr_t inputID) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  coreti->request(((CAPIBuildKey *)key)->getInternalBuildKey().toData(), inputID);
}